

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O2

node_t_conflict
process_tag(c2m_ctx_t c2m_ctx,node_t_conflict r,node_t_conflict id,node_t_conflict decl_list)

{
  anon_union_16_10_0af5b411_for_u *list;
  size_t sVar1;
  size_t sVar2;
  node_t_conflict pnVar3;
  uint uVar4;
  node_t_conflict pnVar5;
  check_ctx *pcVar6;
  char *pcVar7;
  char *pcVar8;
  pos_t pVar9;
  DLIST_node_t temp;
  symbol_t sym;
  
  if (id->code == N_ID) {
    pcVar6 = c2m_ctx->check_ctx;
    while ((pnVar5 = pcVar6->curr_scope, pnVar5 != c2m_ctx->top_scope &&
           ((pnVar5->code & ~N_I) == N_STRUCT))) {
      pcVar6 = (check_ctx *)((long)pnVar5->attr + 0x20);
    }
    sym.def_node = (node_t_conflict)0x0;
    if (decl_list->code == N_IGNORE) {
      sym.def_node = find_def(c2m_ctx,S_TAG,id,pnVar5,(node_t_conflict *)0x0);
      uVar4 = (uint)(sym.def_node != (node_t_conflict)0x0);
    }
    else {
      uVar4 = symbol_find(c2m_ctx,S_TAG,id,pnVar5,&sym);
    }
    pnVar3 = sym.def_node;
    if (uVar4 == 0) {
      symbol_insert(c2m_ctx,S_TAG,id,pnVar5,r,(node_t_conflict)0x0);
    }
    else {
      if ((sym.def_node)->code == r->code) {
        list = &(sym.def_node)->u;
        pnVar5 = DLIST_node_t_el(&list->ops,1);
        if (pnVar5->code == N_IGNORE) {
          if (decl_list->code == N_IGNORE) {
            return pnVar3;
          }
          pcVar8 = (r->u).s.s;
          sVar1 = (r->u).s.len;
          sVar2 = (pnVar3->u).s.len;
          (r->u).s.s = (list->s).s;
          (r->u).s.len = sVar2;
          (list->s).s = pcVar8;
          (pnVar3->u).s.len = sVar1;
          return pnVar3;
        }
        if (decl_list->code == N_IGNORE) {
          return pnVar3;
        }
        pVar9 = get_node_pos(c2m_ctx,id);
        pcVar8 = (id->u).s.s;
        pcVar7 = "tag %s redeclaration";
      }
      else {
        pVar9 = get_node_pos(c2m_ctx,id);
        pcVar8 = (id->u).s.s;
        pcVar7 = "kind of tag %s is unmatched with previous declaration";
      }
      error(c2m_ctx,pcVar7,pVar9.fname,pVar9._8_8_,pcVar8);
    }
  }
  return r;
}

Assistant:

static node_t process_tag (c2m_ctx_t c2m_ctx, node_t r, node_t id, node_t decl_list) {
  check_ctx_t check_ctx = c2m_ctx->check_ctx;
  symbol_t sym;
  int found_p;
  node_t scope, tab_decl_list;

  if (id->code != N_ID) return r;
  scope = curr_scope;
  while (scope != top_scope && (scope->code == N_STRUCT || scope->code == N_UNION))
    scope = ((struct node_scope *) scope->attr)->scope;
  sym.def_node = NULL; /* to remove uninitialized warning */
  if (decl_list->code != N_IGNORE) {
    found_p = symbol_find (c2m_ctx, S_TAG, id, scope, &sym);
  } else {
    sym.def_node = find_def (c2m_ctx, S_TAG, id, scope, NULL);
    found_p = sym.def_node != NULL;
  }
  if (!found_p) {
    symbol_insert (c2m_ctx, S_TAG, id, scope, r, NULL);
  } else if (sym.def_node->code != r->code) {
    error (c2m_ctx, POS (id), "kind of tag %s is unmatched with previous declaration", id->u.s.s);
  } else if ((tab_decl_list = NL_EL (sym.def_node->u.ops, 1))->code != N_IGNORE
             && decl_list->code != N_IGNORE) {
    error (c2m_ctx, POS (id), "tag %s redeclaration", id->u.s.s);
  } else {
    if (decl_list->code != N_IGNORE) { /* swap decl lists */
      DLIST (node_t) temp;
      SWAP (r->u.ops, sym.def_node->u.ops, temp);
    }
    r = sym.def_node;
  }
  return r;
}